

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_set_default(vrna_md_t *md)

{
  vrna_md_t *md_local;
  
  if (md != (vrna_md_t *)0x0) {
    vrna_md_copy(md,&defaults);
  }
  return;
}

Assistant:

PUBLIC void
vrna_md_set_default(vrna_md_t *md)
{
  if (md) /* copy defaults */
    vrna_md_copy(md, &defaults);
}